

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O1

void zerohyp_val(reg_object obj,double *tval,double *pval)

{
  int iVar1;
  int iVar2;
  bparam *pbVar3;
  ulong uVar4;
  int df;
  double dVar5;
  
  iVar1 = obj->N;
  iVar2 = obj->p;
  putchar(10);
  printf("%-25s \n","Zero Hypothesis Test t values and Probabilities (One-tailed)");
  printf("%-25s%-20s%-20s \n","Coefficients","t Value","Probability");
  df = iVar1 - iVar2;
  if (df != 0 && iVar2 <= iVar1) {
    if (0 < obj->p) {
      pbVar3 = obj->beta;
      uVar4 = 0;
      do {
        dVar5 = ABS(pbVar3->value) / pbVar3->stdErr;
        tval[uVar4] = dVar5;
        dVar5 = tcdf(ABS(dVar5),df);
        pval[uVar4] = 1.0 - dVar5;
        printf("B%-25d%-20lf%-20g \n",tval[uVar4],uVar4 & 0xffffffff);
        uVar4 = uVar4 + 1;
        pbVar3 = pbVar3 + 1;
      } while ((long)uVar4 < (long)obj->p);
    }
    return;
  }
  printf("degrees of freedom cannot be non-positive");
  return;
}

Assistant:

void zerohyp_val(reg_object obj, double *tval, double *pval) {
	int df, i;
	/*
	* Zero Hypothesis Test for CLRM
	*/

	df = obj->N - obj->p;
	printf("\n");
	printf("%-25s \n", "Zero Hypothesis Test t values and Probabilities (One-tailed)");
	printf("%-25s%-20s%-20s \n", "Coefficients", "t Value", "Probability");
	if (df > 0) {
		for (i = 0; i < obj->p; ++i) {
			tval[i] = fabs((obj->beta + i)->value) / (obj->beta + i)->stdErr;
			pval[i] = 1.0 - tcdf(fabs(tval[i]), df);
			printf("B%-25d%-20lf%-20g \n", i, tval[i], pval[i]);
		}
	}
	else {
		printf("degrees of freedom cannot be non-positive");
	}
}